

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IReferenceCounted.h
# Opt level: O2

void __thiscall
irr::video::COpenGLSLMaterialRenderer::COpenGLSLMaterialRenderer
          (COpenGLSLMaterialRenderer *this,COpenGLDriver *driver,
          IShaderConstantSetCallBack *callback,E_MATERIAL_TYPE baseMaterial,s32 userData)

{
  *(undefined8 *)&this->field_0x60 = 0;
  *(undefined4 *)&this->field_0x68 = 1;
  (this->super_IMaterialRenderer)._vptr_IMaterialRenderer = (_func_int **)0x282098;
  *(undefined8 *)&this->field_0x58 = 0x2821b0;
  *(undefined8 *)&(this->super_IMaterialRenderer).field_0x8 = 0x282138;
  *(COpenGLDriver **)&(this->super_IMaterialRenderer).field_0x10 = driver;
  *(IShaderConstantSetCallBack **)&(this->super_IMaterialRenderer).field_0x18 = callback;
  this->Alpha = false;
  this->Blending = false;
  this->AlphaTest = false;
  this->Program = 0;
  this->Program2 = 0;
  (this->UniformInfo).m_data.
  super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->UniformInfo).m_data.
  super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->UniformInfo).m_data.
  super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->UniformInfo).is_sorted = true;
  this->UserData = userData;
  switch(baseMaterial) {
  case EMT_TRANSPARENT_ALPHA_CHANNEL:
  case EMT_TRANSPARENT_VERTEX_ALPHA:
    this->Alpha = true;
    break;
  case EMT_TRANSPARENT_ALPHA_CHANNEL_REF:
    this->AlphaTest = true;
    break;
  case EMT_ONETEXTURE_BLEND:
    this->Blending = true;
  }
  if (callback != (IShaderConstantSetCallBack *)0x0) {
    *(int *)(&callback->field_0x10 + (long)callback->_vptr_IShaderConstantSetCallBack[-3]) =
         *(int *)(&callback->field_0x10 + (long)callback->_vptr_IShaderConstantSetCallBack[-3]) + 1;
  }
  return;
}

Assistant:

IReferenceCounted() :
			DebugName(0), ReferenceCounter(1)
	{
	}